

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

ostream * AixLog::operator<<(ostream *os,Severity *log_severity)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream oVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  ostream *extraout_RAX;
  ostream *poVar5;
  undefined8 uVar6;
  ostream *local_1c8;
  long local_1c0;
  undefined4 local_1b8;
  undefined1 uStack_1b4;
  undefined1 uStack_1b3;
  undefined1 uStack_1b2;
  undefined1 uStack_1b1;
  Function local_1a8;
  ios_base local_128 [264];
  
  if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)__dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                             *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo
                                    ,&Log::typeinfo,0);
  }
  if (plVar4 != (long *)0x0) {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)(plVar4 + 0x29));
    if (iVar3 == 0) {
      if (*(ostream *)(plVar4 + 0x10) != *os) {
        (**(code **)(*plVar4 + 0x30))(plVar4);
        *(ostream *)(plVar4 + 0x10) = *os;
        plVar4[0x23] = 0;
        *(undefined1 *)(plVar4 + 0x24) = 1;
        local_1a8._vptr_Function = (_func_int **)&PTR__Tag_001edee0;
        paVar1 = &local_1a8.name.field_2;
        local_1a8.name._M_string_length = 0;
        local_1a8.name.field_2._M_local_buf[0] = '\0';
        local_1a8.file._M_dataplus._M_p._0_1_ = 1;
        local_1a8.name._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_assign((string *)(plVar4 + 0x12));
        *(undefined1 *)(plVar4 + 0x16) = local_1a8.file._M_dataplus._M_p._0_1_;
        local_1a8._vptr_Function = (_func_int **)&PTR__Tag_001edee0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8.name._M_dataplus._M_p,
                          CONCAT71(local_1a8.name.field_2._M_allocated_capacity._1_7_,
                                   local_1a8.name.field_2._M_local_buf[0]) + 1);
        }
        Function::Function(&local_1a8,(nullptr_t)0x0);
        std::__cxx11::string::_M_assign((string *)(plVar4 + 0x18));
        std::__cxx11::string::_M_assign((string *)(plVar4 + 0x1c));
        *(bool *)(plVar4 + 0x21) = local_1a8.is_null_;
        plVar4[0x20] = local_1a8.line;
        Function::~Function(&local_1a8);
        *(undefined1 *)(plVar4 + 0x25) = 1;
      }
      iVar3 = pthread_mutex_unlock((pthread_mutex_t *)(plVar4 + 0x29));
      return (ostream *)CONCAT44(extraout_var,iVar3);
    }
    uVar6 = std::__throw_system_error(iVar3);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
    std::ios_base::~ios_base(local_128);
    _Unwind_Resume(uVar6);
  }
  oVar2 = *os;
  switch(oVar2) {
  case (ostream)0x0:
    local_1b8 = 0x63617254;
    uStack_1b4 = 0x65;
    break;
  case (ostream)0x1:
    local_1b8 = 0x75626544;
    uStack_1b4 = 0x67;
    break;
  case (ostream)0x2:
    local_1b8 = 0x6f666e49;
    goto LAB_001b2aa1;
  case (ostream)0x3:
    local_1c8 = (ostream *)&local_1b8;
    local_1b8 = 0x69746f4e;
    uStack_1b4 = 99;
    uStack_1b3 = 0x65;
    local_1c0 = 6;
    uStack_1b2 = 0;
    goto LAB_001b2b69;
  case (ostream)0x4:
    local_1b8 = 0x6e726157;
LAB_001b2aa1:
    local_1c8 = (ostream *)&local_1b8;
    local_1c0 = 4;
    uStack_1b4 = 0;
    goto LAB_001b2b69;
  case (ostream)0x5:
    local_1b8 = 0x6f727245;
    uStack_1b4 = 0x72;
    break;
  case (ostream)0x6:
    local_1b8 = 0x61746146;
    uStack_1b4 = 0x6c;
    break;
  default:
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
    std::ostream::operator<<(&local_1a8.name._M_string_length,(int)(char)oVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
    std::ios_base::~ios_base(local_128);
    goto LAB_001b2b69;
  }
  local_1c8 = (ostream *)&local_1b8;
  uStack_1b3 = 0;
  local_1c0 = 5;
LAB_001b2b69:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,(char *)local_1c8,local_1c0);
  poVar5 = (ostream *)&local_1b8;
  if (local_1c8 != poVar5) {
    operator_delete(local_1c8,
                    CONCAT17(uStack_1b1,
                             CONCAT16(uStack_1b2,CONCAT15(uStack_1b3,CONCAT14(uStack_1b4,local_1b8))
                                     )) + 1);
    poVar5 = extraout_RAX;
  }
  return poVar5;
}

Assistant:

static std::ostream& operator<<(std::ostream& os,
                                const Severity& log_severity) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    if (log->metadata_.severity != log_severity) {
      log->sync();
      log->metadata_.severity = log_severity;
      log->metadata_.timestamp = nullptr;
      log->metadata_.tag = nullptr;
      log->metadata_.function = nullptr;
      log->conditional_.set(true);
    }
  } else {
    os << to_string(log_severity);
  }
  return os;
}